

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-common.cpp
# Opt level: O3

int main(void)

{
  uint len;
  uint length;
  
  length = 0;
  do {
    test_common<unsigned_char>(length,'*');
    test_common<signed_char>(length,'*');
    test_common<unsigned_short>(length,0x2a);
    test_common<short>(length,0x2a);
    test_common<unsigned_int>(length,0x2a);
    test_common<int>(length,0x2a);
    test_common<unsigned_long>(length,0x2a);
    test_common<long>(length,0x2a);
    test_common<float>(length,42.0);
    test_common<double>(length,42.0);
    length = length + 1;
  } while (length != 0x80);
  return 0;
}

Assistant:

int main()
{
    try
    {
        for (unsigned len = 0; len < 128; ++len)
        {
#ifndef NO_8_16
            test_common<uint8_t>(len);
            test_common<int8_t>(len);
            test_common<uint16_t>(len);
            test_common<int16_t>(len);
#endif
            test_common<uint32_t>(len);
            test_common<int32_t>(len);
            test_common<uint64_t>(len);
            test_common<int64_t>(len);

            test_common<float>(len);
            test_common<double>(len);
        }
    }
    catch (const Exception& ex)
    {
        std::cerr << "func: " << ex.func_ << " line: " << ex.line_ << " len: " << ex.length_ << std::endl;
        return 1;
    }

    return 0;
}